

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTcpIpConnection.cxx
# Opt level: O3

void __thiscall cmTcpIpConnection::cmTcpIpConnection(cmTcpIpConnection *this,int port)

{
  cmEventBasedConnection::cmEventBasedConnection
            (&this->super_cmEventBasedConnection,(cmConnectionBufferStrategy *)0x0);
  (this->super_cmEventBasedConnection).super_cmConnection._vptr_cmConnection =
       (_func_int **)&PTR_WriteData_006f3d50;
  this->Port = port;
  auto_handle_base_<uv_tcp_s>::auto_handle_base_((auto_handle_base_<uv_tcp_s> *)&this->ServerHandle)
  ;
  (this->ServerHandle).super_auto_handle_<uv_tcp_s>.super_auto_handle_base_<uv_tcp_s>.
  _vptr_auto_handle_base_ = (_func_int **)&PTR_allocate_006f2f88;
  auto_handle_base_<uv_tcp_s>::auto_handle_base_((auto_handle_base_<uv_tcp_s> *)&this->ClientHandle)
  ;
  (this->ClientHandle).super_auto_handle_<uv_tcp_s>.super_auto_handle_base_<uv_tcp_s>.
  _vptr_auto_handle_base_ = (_func_int **)&PTR_allocate_006f2f88;
  return;
}

Assistant:

cmTcpIpConnection::cmTcpIpConnection(int port)
  : Port(port)
{
}